

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_usage.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  App *pAVar1;
  Option *pOVar2;
  allocator local_939;
  int local_938;
  allocator local_933;
  allocator local_932;
  allocator local_931;
  string local_930;
  int subopt;
  int level;
  string local_908;
  string usage_msg;
  string output_file_name;
  string input_file_name;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0 [32];
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0 [32];
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620 [32];
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  Validator local_4c0;
  Validator local_458;
  Validator local_3f0;
  App app;
  
  input_file_name._M_dataplus._M_p = (pointer)&input_file_name.field_2;
  input_file_name._M_string_length = 0;
  input_file_name.field_2._M_local_buf[0] = '\0';
  output_file_name._M_dataplus._M_p = (pointer)&output_file_name.field_2;
  output_file_name._M_string_length = 0;
  output_file_name.field_2._M_local_buf[0] = '\0';
  level = 5;
  subopt = 0;
  std::__cxx11::string::string((string *)&local_560,"CLI11 help",(allocator *)&usage_msg);
  std::__cxx11::string::string((string *)&local_580,"",(allocator *)&local_930);
  CLI::App::App(&app,&local_560,&local_580);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_560);
  app.require_subcommand_min_ = 1;
  app.require_subcommand_max_ = 1;
  std::__cxx11::string::string((string *)&local_5a0,"e",(allocator *)&usage_msg);
  std::__cxx11::string::string((string *)&local_5c0,"encode",(allocator *)&local_930);
  pAVar1 = CLI::App::add_subcommand(&app,&local_5a0,&local_5c0);
  pAVar1 = CLI::App::ignore_case(pAVar1,true);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::string((string *)&local_5e0,"input",(allocator *)&local_930);
  std::__cxx11::string::string((string *)&local_600,"input file",(allocator *)&local_908);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar1,&local_5e0,&input_file_name,&local_600);
  std::__cxx11::string::string(local_620," ",(allocator *)&local_938);
  std::__cxx11::string::operator=((string *)&pOVar2->option_text_,local_620);
  (pOVar2->super_OptionBase<CLI::Option>).required_ = true;
  CLI::Validator::Validator(&local_3f0,(Validator *)CLI::ExistingFile);
  std::__cxx11::string::string((string *)&usage_msg,"",&local_939);
  CLI::Option::check(pOVar2,&local_3f0,&usage_msg);
  std::__cxx11::string::~string((string *)&usage_msg);
  CLI::Validator::~Validator(&local_3f0);
  std::__cxx11::string::~string(local_620);
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::string((string *)&local_640,"output",(allocator *)&usage_msg);
  std::__cxx11::string::string((string *)&local_660,"output file",(allocator *)&local_930);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar1,&local_640,&output_file_name,&local_660);
  std::__cxx11::string::string(local_4e0," ",(allocator *)&local_908);
  std::__cxx11::string::operator=((string *)&pOVar2->option_text_,local_4e0);
  (pOVar2->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string(local_4e0);
  std::__cxx11::string::~string((string *)&local_660);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::string((string *)&local_680,"-l, --level",&local_939);
  std::__cxx11::string::string((string *)&local_6a0,"encoding level",&local_931);
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar1,&local_680,&level,&local_6a0);
  std::__cxx11::string::string(local_6c0,"[1..9]",&local_932);
  std::__cxx11::string::operator=((string *)&pOVar2->option_text_,local_6c0);
  local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
  local_930._M_string_length = 0;
  local_930.field_2._M_local_buf[0] = '\0';
  CLI::Range::Range<int>((Range *)&usage_msg,1,9,&local_930);
  CLI::Validator::Validator(&local_458,(Validator *)&usage_msg);
  std::__cxx11::string::string((string *)&local_908,"",&local_933);
  pOVar2 = CLI::Option::check(pOVar2,&local_458,&local_908);
  local_938 = 5;
  CLI::Option::default_val<int>(pOVar2,&local_938);
  std::__cxx11::string::~string((string *)&local_908);
  CLI::Validator::~Validator(&local_458);
  CLI::Validator::~Validator((Validator *)&usage_msg);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string(local_6c0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::string((string *)&local_6e0,"-R, --remove",(allocator *)&usage_msg);
  CLI::App::add_flag<const_char[18],_(CLI::detail::enabler)0>
            (pAVar1,&local_6e0,(char (*) [18])"remove input file");
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__cxx11::string::string((string *)&local_700,"-s, --suboption",(allocator *)&usage_msg);
  std::__cxx11::string::string((string *)&local_720,"suboption",(allocator *)&local_930);
  pOVar2 = CLI::App::add_flag<int,_(CLI::detail::enabler)0>(pAVar1,&local_700,&subopt,&local_720);
  std::__cxx11::string::string(local_500," ",(allocator *)&local_908);
  std::__cxx11::string::operator=((string *)&pOVar2->option_text_,local_500);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string((string *)&local_720);
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::string((string *)&local_740,"d",(allocator *)&usage_msg);
  std::__cxx11::string::string((string *)&local_760,"decode",(allocator *)&local_930);
  pAVar1 = CLI::App::add_subcommand(&app,&local_740,&local_760);
  pAVar1 = CLI::App::ignore_case(pAVar1,true);
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string((string *)&local_740);
  std::__cxx11::string::string((string *)&local_780,"input",(allocator *)&local_930);
  std::__cxx11::string::string((string *)&local_7a0,"input file",(allocator *)&local_908);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar1,&local_780,&input_file_name,&local_7a0);
  std::__cxx11::string::string(local_7c0," ",(allocator *)&local_938);
  std::__cxx11::string::operator=((string *)&pOVar2->option_text_,local_7c0);
  (pOVar2->super_OptionBase<CLI::Option>).required_ = true;
  CLI::Validator::Validator(&local_4c0,(Validator *)CLI::ExistingFile);
  std::__cxx11::string::string((string *)&usage_msg,"",&local_939);
  CLI::Option::check(pOVar2,&local_4c0,&usage_msg);
  std::__cxx11::string::~string((string *)&usage_msg);
  CLI::Validator::~Validator(&local_4c0);
  std::__cxx11::string::~string(local_7c0);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::__cxx11::string::~string((string *)&local_780);
  std::__cxx11::string::string((string *)&local_7e0,"output",(allocator *)&usage_msg);
  std::__cxx11::string::string((string *)&local_800,"output file",(allocator *)&local_930);
  pOVar2 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar1,&local_7e0,&output_file_name,&local_800);
  std::__cxx11::string::string(local_520," ",(allocator *)&local_908);
  std::__cxx11::string::operator=((string *)&pOVar2->option_text_,local_520);
  (pOVar2->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::string((string *)&local_908,*argv,(allocator *)&local_938);
  std::operator+(&local_930,"Usage: ",&local_908);
  std::operator+(&usage_msg,&local_930," <command> [options] <input-file> <output-file>");
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::string(local_540,(string *)&usage_msg);
  std::__cxx11::string::operator=((string *)&app.usage_,local_540);
  std::__cxx11::string::~string(local_540);
  std::__cxx11::string::string((string *)&local_820,"",(allocator *)&local_908);
  std::__cxx11::string::string((string *)&local_930,"",(allocator *)&local_938);
  CLI::App::set_help_flag(&app,&local_820,&local_930);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::string((string *)&local_840,"-h, --help",(allocator *)&local_908);
  std::__cxx11::string::string((string *)&local_930,"",(allocator *)&local_938);
  CLI::App::set_help_all_flag(&app,&local_840,&local_930);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_840);
  CLI::App::parse_char_t<char>(&app,argc,argv);
  std::__cxx11::string::~string((string *)&usage_msg);
  CLI::App::~App(&app);
  std::__cxx11::string::~string((string *)&output_file_name);
  std::__cxx11::string::~string((string *)&input_file_name);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    std::string input_file_name, output_file_name;
    int level{5}, subopt{0};

    // app caption
    CLI::App app{"CLI11 help"};

    app.require_subcommand(1);
    // subcommands options and flags
    CLI::App *const encode = app.add_subcommand("e", "encode")->ignore_case();  // ignore case
    encode->add_option("input", input_file_name, "input file")
        ->option_text(" ")
        ->required()
        ->check(CLI::ExistingFile);                                                               // file must exist
    encode->add_option("output", output_file_name, "output file")->option_text(" ")->required();  // required option
    encode->add_option("-l, --level", level, "encoding level")
        ->option_text("[1..9]")
        ->check(CLI::Range(1, 9))
        ->default_val(5);                                   // limit parameter range
    encode->add_flag("-R, --remove", "remove input file");  // no parameter option
    encode->add_flag("-s, --suboption", subopt, "suboption")->option_text(" ");

    CLI::App *const decode = app.add_subcommand("d", "decode")->ignore_case();
    decode->add_option("input", input_file_name, "input file")->option_text(" ")->required()->check(CLI::ExistingFile);
    decode->add_option("output", output_file_name, "output file")->option_text(" ")->required();

    // Usage message modification
    std::string usage_msg = "Usage: " + std::string(argv[0]) + " <command> [options] <input-file> <output-file>";
    app.usage(usage_msg);
    // flag to display full help at once
    app.set_help_flag("");
    app.set_help_all_flag("-h, --help");

    CLI11_PARSE(app, argc, argv);

    return 0;
}